

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::staticSolve(btSoftBody *this,int iterations)

{
  long lVar1;
  int iVar2;
  
  if (0 < iterations) {
    iVar2 = 0;
    do {
      if (0 < (this->m_cfg).m_psequence.m_size) {
        lVar1 = 0;
        do {
          (*(code *)(&PTR_PSolve_Links_00229448)[(int)(this->m_cfg).m_psequence.m_data[lVar1]])
                    (0x3f800000,0,this);
          lVar1 = lVar1 + 1;
        } while (lVar1 < (this->m_cfg).m_psequence.m_size);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != iterations);
  }
  return;
}

Assistant:

void			btSoftBody::staticSolve(int iterations)
{
	for(int isolve=0;isolve<iterations;++isolve)
	{
		for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
		{
			getSolver(m_cfg.m_psequence[iseq])(this,1,0);
		}
	}
}